

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:220:23)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:220:23)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::Maybe<unsigned_long>_> depResult;
  MessageReaderAndFds local_3b8;
  Maybe<unsigned_long> local_390;
  NullableValue<kj::Exception> local_380;
  char local_1e8;
  char local_1e0;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_1d8;
  ExceptionOr<capnp::MessageReaderAndFds> local_1d0;
  
  local_380.isSet = false;
  local_1e8 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_380);
  if (local_380.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1d0,&local_380.field_1.value);
    local_1d0.value.ptr.isSet = false;
    ExceptionOr<capnp::MessageReaderAndFds>::operator=
              ((ExceptionOr<capnp::MessageReaderAndFds> *)output,&local_1d0);
    ExceptionOr<capnp::MessageReaderAndFds>::~ExceptionOr(&local_1d0);
  }
  else if (local_1e8 == '\x01') {
    local_390.ptr.isSet = (bool)local_1e0;
    if (local_1e0 == '\x01') {
      local_390.ptr.field_1 = local_1d8;
      local_1e0 = '\0';
    }
    anon_class_32_2_fe89d4e7_for_func::operator()(&local_3b8,&this->func,&local_390);
    local_1d0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1d0.value.ptr.isSet = true;
    local_1d0.value.ptr.field_1.value.reader.disposer = local_3b8.reader.disposer;
    local_1d0.value.ptr.field_1.value.reader.ptr = local_3b8.reader.ptr;
    local_3b8.reader.ptr = (MessageReader *)0x0;
    local_1d0.value.ptr.field_1.value.fds.ptr = local_3b8.fds.ptr;
    local_1d0.value.ptr.field_1.value.fds.size_ = local_3b8.fds.size_;
    ExceptionOr<capnp::MessageReaderAndFds>::operator=
              ((ExceptionOr<capnp::MessageReaderAndFds> *)output,&local_1d0);
    ExceptionOr<capnp::MessageReaderAndFds>::~ExceptionOr(&local_1d0);
    Own<capnp::MessageReader,_std::nullptr_t>::dispose(&local_3b8.reader);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_380);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }